

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O3

void disruptor::test::BlockingStrategy::SignalTimeoutWaitingOnCursor_invoker(void)

{
  undefined8 uVar1;
  SignalTimeoutWaitingOnCursor t;
  string local_4e0;
  undefined7 uStack_4df;
  undefined1 local_4d0 [16];
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  string local_470;
  undefined7 uStack_46f;
  undefined1 local_460 [96];
  ios_base local_400 [264];
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 local_288 [176];
  atomic<long> local_1d8;
  atomic<long> local_160;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [24];
  atomic<long> local_e8;
  pointer local_a8;
  pointer ppSStack_a0;
  pointer local_98;
  __native_type _Stack_90;
  condition_variable local_68 [48];
  atomic<bool> local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_478 = "";
  memset((ostringstream *)local_288,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  local_108 = 0;
  local_100[0] = 0;
  local_470 = (string)0x22;
  local_110 = local_100;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,(char *)&local_470,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_288,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_110,&local_470);
  if ((undefined1 *)CONCAT71(uStack_46f,local_470) != local_460) {
    operator_delete((undefined1 *)CONCAT71(uStack_46f,local_470));
  }
  local_298 = local_110;
  local_290 = local_110 + local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x17b);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  local_288._56_8_ = -1;
  local_1d8.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_160.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_e8.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_a8 = (pointer)0x0;
  ppSStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  _Stack_90.__align = 0;
  _Stack_90._8_8_ = 0;
  _Stack_90._16_8_ = 0;
  _Stack_90.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_90.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_68);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38._M_base._M_i = (__atomic_base<bool>)false;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_488 = "";
  memset((ostringstream *)&local_470,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
  local_2f0 = 0;
  local_2e8[0] = 0;
  local_4e0 = (string)0x22;
  local_2f8 = local_2e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,(char *)&local_4e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_470,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2f8,&local_4e0);
  if ((undefined1 *)CONCAT71(uStack_4df,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4df,local_4e0));
  }
  local_2a8 = local_2f8;
  local_2a0 = local_2f8 + local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_490,0x17b);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
  std::ios_base::~ios_base(local_400);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_498 = "";
  memset((ostringstream *)&local_470,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
  local_2f0 = 0;
  local_2e8[0] = 0;
  local_4e0 = (string)0x22;
  local_2f8 = local_2e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,(char *)&local_4e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_470,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2f8,&local_4e0);
  if ((undefined1 *)CONCAT71(uStack_4df,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4df,local_4e0));
  }
  local_2b8 = local_2f8;
  local_2b0 = local_2f8 + local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4a0,0x17b);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
  std::ios_base::~ios_base(local_400);
  SignalTimeoutWaitingOnCursor::test_method((SignalTimeoutWaitingOnCursor *)local_288);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_4a8 = "";
  memset((ostringstream *)&local_470,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
  local_2f0 = 0;
  local_2e8[0] = 0;
  local_4e0 = (string)0x22;
  local_2f8 = local_2e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,(char *)&local_4e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_470,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_470,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2f8,&local_4e0);
  if ((undefined1 *)CONCAT71(uStack_4df,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4df,local_4e0));
  }
  local_2c8 = local_2f8;
  local_2c0 = local_2f8 + local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x17b);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
  std::ios_base::~ios_base(local_400);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_4b8 = "";
  memset((ostringstream *)&local_470,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_470);
  local_2f0 = 0;
  local_2e8[0] = 0;
  local_4e0 = (string)0x22;
  local_2f8 = local_2e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,(char *)&local_4e0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_470,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_470,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2f8,&local_4e0);
  if ((undefined1 *)CONCAT71(uStack_4df,local_4e0) != local_4d0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4df,local_4e0));
  }
  local_2d8 = local_2f8;
  local_2d0 = local_2f8 + local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4c0,0x17b);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_470);
  std::ios_base::~ios_base(local_400);
  std::condition_variable::~condition_variable(local_68);
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}